

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

_Bool sftp_get_file(char *fname,char *outfname,_Bool recurse,_Bool restart)

{
  StripCtrlChars *pSVar1;
  _Bool _Var2;
  bool bVar3;
  int iVar4;
  sftp_request *psVar5;
  sftp_packet *psVar6;
  fxp_handle *pfVar7;
  WFile *f;
  uint64_t offset;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  fxp_xfer *xfer;
  fxp_names *names;
  void *pvVar11;
  fxp_name *pfVar12;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  _Bool _Var13;
  char *__format;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  undefined4 uVar19;
  long lVar20;
  ptrlen str;
  ptrlen str_00;
  ptrlen str_01;
  ptrlen str_02;
  ptrlen str_03;
  ptrlen str_04;
  ptrlen str_05;
  ptrlen str_06;
  ptrlen str_07;
  wchar_t len;
  size_t namesize;
  fxp_attrs attrs;
  int local_94;
  fxp_handle *local_90;
  void *local_88;
  undefined4 local_7c;
  fxp_handle *local_78;
  char *local_70;
  fxp_attrs local_68;
  
  if ((int)CONCAT71(in_register_00000011,recurse) == 0) {
LAB_0010f4af:
    psVar5 = fxp_stat_send(fname);
    psVar6 = sftp_wait_for_reply(psVar5);
    _Var2 = fxp_stat_recv(psVar6,psVar5,&local_68);
    if (!_Var2) {
      local_68.flags = 0;
    }
    psVar5 = fxp_open_send(fname,1,(fxp_attrs *)0x0);
    psVar6 = sftp_wait_for_reply(psVar5);
    pfVar7 = fxp_open_recv(psVar6,psVar5);
    pSVar1 = string_scc;
    if (pfVar7 != (fxp_handle *)0x0) {
      if (restart) {
        f = open_existing_wfile(outfname,(uint64_t *)0x0);
        if (f == (WFile *)0x0) goto LAB_0010f7a7;
        iVar4 = seek_file(f,0,2);
        if (iVar4 != -1) {
          offset = get_file_posn(f);
          printf("reget: restarting at file position %lu\n",offset);
          goto LAB_0010f5e5;
        }
        close_wfile(f);
        pSVar1 = string_scc;
        sVar8 = strlen(outfname);
        str_03.len = sVar8;
        str_03.ptr = outfname;
        pcVar9 = stripctrl_string_ptrlen(pSVar1,str_03);
        if (pcVar9 == (char *)0x0) goto LAB_0010f821;
        pcVar10 = "reget: cannot restart %s - file too large\n";
      }
      else {
        offset = 0;
        f = open_new_file(outfname,-(ulong)((local_68.flags & 4) == 0) |
                                   CONCAT62(local_68.permissions._2_6_,
                                            CONCAT11(local_68.permissions._1_1_,
                                                     (undefined1)local_68.permissions)));
        if (f != (WFile *)0x0) {
LAB_0010f5e5:
          pSVar1 = string_scc;
          local_90 = pfVar7;
          sVar8 = strlen(fname);
          str_00.len = sVar8;
          str_00.ptr = fname;
          pcVar9 = stripctrl_string_ptrlen(pSVar1,str_00);
          pSVar1 = string_scc;
          if (pcVar9 != (char *)0x0) {
            sVar8 = strlen(outfname);
            str_01.len = sVar8;
            str_01.ptr = outfname;
            pcVar10 = stripctrl_string_ptrlen(pSVar1,str_01);
            if (pcVar10 != (char *)0x0) {
              printf("remote:%s => local:%s\n",pcVar9,pcVar10);
              safefree(pcVar10);
            }
            safefree(pcVar9);
          }
          xfer = xfer_download_init(local_90,offset);
          _Var2 = xfer_done(xfer);
          _Var13 = true;
          if (!_Var2) {
            _Var13 = true;
            bVar3 = false;
            do {
              xfer_download_queue(xfer);
              psVar6 = sftp_recv();
              iVar4 = xfer_download_gotpkt(xfer,psVar6);
              if (iVar4 < 1) {
                if (!bVar3) {
                  pcVar9 = fxp_error();
                  printf("error while reading: %s\n",pcVar9);
                }
                bVar3 = true;
                _Var13 = false;
              }
              while (_Var2 = xfer_download_data(xfer,&local_88,&local_94), pvVar11 = local_88, _Var2
                    ) {
                if (local_94 < 1) {
                  uVar14 = 0;
                }
                else {
                  uVar14 = 0;
                  do {
                    iVar4 = write_to_file(f,(void *)(uVar14 + (long)pvVar11),local_94 - (int)uVar14)
                    ;
                    if (iVar4 < 1) {
                      puts("error while writing local file");
                      xfer_set_error(xfer);
                      _Var13 = false;
                      break;
                    }
                    uVar18 = (int)uVar14 + iVar4;
                    uVar14 = (ulong)uVar18;
                  } while ((int)uVar18 < local_94);
                }
                if ((int)uVar14 < local_94) {
                  xfer_set_error(xfer);
                  _Var13 = false;
                }
                safefree(local_88);
              }
              _Var2 = xfer_done(xfer);
            } while (!_Var2);
          }
          xfer_cleanup(xfer);
          close_wfile(f);
          psVar5 = fxp_close_send(local_90);
          psVar6 = sftp_wait_for_reply(psVar5);
          fxp_close_recv(psVar6,psVar5);
          return _Var13;
        }
LAB_0010f7a7:
        pSVar1 = string_scc;
        sVar8 = strlen(outfname);
        str_02.len = sVar8;
        str_02.ptr = outfname;
        pcVar9 = stripctrl_string_ptrlen(pSVar1,str_02);
        if (pcVar9 == (char *)0x0) goto LAB_0010f821;
        pcVar10 = "local: unable to open %s\n";
      }
      printf(pcVar10,pcVar9);
      safefree(pcVar9);
LAB_0010f821:
      psVar5 = fxp_close_send(pfVar7);
      psVar6 = sftp_wait_for_reply(psVar5);
      fxp_close_recv(psVar6,psVar5);
      return false;
    }
    sVar8 = strlen(fname);
    str.len = sVar8;
    str.ptr = fname;
    pcVar9 = stripctrl_string_ptrlen(pSVar1,str);
    if (pcVar9 == (char *)0x0) {
      return false;
    }
    pcVar10 = fxp_error();
    __format = "%s: open for read: %s\n";
  }
  else {
    psVar5 = fxp_stat_send(fname);
    psVar6 = sftp_wait_for_reply(psVar5);
    _Var2 = fxp_stat_recv(psVar6,psVar5,&local_68);
    if (((!_Var2) || ((local_68.flags & 4) == 0)) || ((local_68.permissions._1_1_ & 0x40) == 0))
    goto LAB_0010f4af;
    iVar4 = file_type(outfname);
    if ((iVar4 != 2) && (_Var2 = create_directory(outfname), pSVar1 = string_scc, !_Var2)) {
      sVar8 = strlen(outfname);
      str_06.len = sVar8;
      str_06.ptr = outfname;
      pcVar9 = stripctrl_string_ptrlen(pSVar1,str_06);
      if (pcVar9 == (char *)0x0) {
        return false;
      }
      printf("%s: Cannot create directory\n",pcVar9);
      goto LAB_0010f5a8;
    }
    psVar5 = fxp_opendir_send(fname);
    psVar6 = sftp_wait_for_reply(psVar5);
    local_78 = fxp_opendir_recv(psVar6,psVar5);
    pSVar1 = string_scc;
    if (local_78 != (fxp_handle *)0x0) {
      local_7c = (undefined4)CONCAT71(in_register_00000009,restart);
      local_88 = (void *)0x0;
      local_70 = outfname;
      psVar5 = fxp_readdir_send(local_78);
      psVar6 = sftp_wait_for_reply(psVar5);
      names = fxp_readdir_recv(psVar6,psVar5);
      local_90 = (fxp_handle *)fname;
      if (names == (fxp_names *)0x0) {
        pvVar11 = (void *)0x0;
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        pvVar11 = (void *)0x0;
        do {
          if ((long)names->nnames == 0) {
            fxp_free_names(names);
            goto LAB_0010fb07;
          }
          pvVar11 = safegrowarray(pvVar11,(size_t *)&local_88,8,uVar14,(long)names->nnames,false);
          if (0 < names->nnames) {
            lVar15 = 0;
            lVar20 = 0;
            do {
              pcVar9 = *(char **)((long)&names->names->filename + lVar15);
              if ((*pcVar9 != '.') ||
                 ((pcVar9[1] != '\0' && ((pcVar9[1] != '.' || (pcVar9[2] != '\0')))))) {
                _Var2 = vet_filename(pcVar9);
                pSVar1 = string_scc;
                if (_Var2) {
                  pfVar12 = fxp_dup_name((fxp_name *)((long)&names->names->filename + lVar15));
                  *(fxp_name **)((long)pvVar11 + uVar14 * 8) = pfVar12;
                  uVar14 = uVar14 + 1;
                }
                else {
                  pcVar9 = *(char **)((long)&names->names->filename + lVar15);
                  sVar8 = strlen(pcVar9);
                  str_04.len = sVar8;
                  str_04.ptr = pcVar9;
                  pcVar9 = stripctrl_string_ptrlen(pSVar1,str_04);
                  if (pcVar9 != (char *)0x0) {
                    printf("ignoring potentially dangerous server-supplied filename \'%s\'\n",pcVar9
                          );
                    safefree(pcVar9);
                  }
                }
              }
              lVar20 = lVar20 + 1;
              lVar15 = lVar15 + 0x48;
            } while (lVar20 < names->nnames);
          }
          fxp_free_names(names);
          psVar5 = fxp_readdir_send(local_78);
          psVar6 = sftp_wait_for_reply(psVar5);
          names = fxp_readdir_recv(psVar6,psVar5);
        } while (names != (fxp_names *)0x0);
      }
      pfVar7 = local_90;
      iVar4 = fxp_error_type();
      pSVar1 = string_scc;
      if (iVar4 != 1) {
        sVar8 = strlen((char *)pfVar7);
        str_07.len = sVar8;
        str_07.ptr = pfVar7;
        pcVar9 = stripctrl_string_ptrlen(pSVar1,str_07);
        if (pcVar9 != (char *)0x0) {
          pcVar10 = fxp_error();
          printf("%s: reading directory: %s\n",pcVar9,pcVar10);
          safefree(pcVar9);
        }
        psVar5 = fxp_close_send(local_78);
        psVar6 = sftp_wait_for_reply(psVar5);
        fxp_close_recv(psVar6,psVar5);
LAB_0010fc7e:
        safefree(pvVar11);
        return false;
      }
LAB_0010fb07:
      psVar5 = fxp_close_send(local_78);
      psVar6 = sftp_wait_for_reply(psVar5);
      fxp_close_recv(psVar6,psVar5);
      pcVar9 = local_70;
      if (uVar14 != 0) {
        qsort(pvVar11,uVar14,8,sftp_name_compare);
      }
      iVar4 = 0;
      if ((char)local_7c != '\0') {
        uVar17 = 0xffffffffffffffff;
        do {
          uVar16 = uVar14;
          if (uVar17 - uVar14 == -1) break;
          pcVar10 = dir_file_cat(pcVar9,(char *)**(undefined8 **)((long)pvVar11 + uVar17 * 8 + 8));
          iVar4 = file_type(pcVar10);
          safefree(pcVar10);
          uVar16 = uVar17 + 1;
          uVar17 = uVar16;
        } while (iVar4 != 0);
        iVar4 = (int)uVar16 + -1;
        if ((int)uVar16 == 0) {
          iVar4 = 0;
        }
      }
      uVar17 = (ulong)iVar4;
      uVar19 = local_7c;
      if (uVar17 < uVar14) {
        do {
          pcVar10 = dupcat_fn((char *)local_90,"/",**(undefined8 **)((long)pvVar11 + uVar17 * 8),0);
          pcVar9 = dir_file_cat(pcVar9,(char *)**(undefined8 **)((long)pvVar11 + uVar17 * 8));
          _Var2 = sftp_get_file(pcVar10,pcVar9,true,(_Bool)((byte)uVar19 & 1));
          safefree(pcVar9);
          safefree(pcVar10);
          if (!_Var2) {
            uVar17 = 0;
            do {
              fxp_free_name(*(fxp_name **)((long)pvVar11 + uVar17 * 8));
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
            goto LAB_0010fc7e;
          }
          uVar17 = uVar17 + 1;
          pcVar9 = local_70;
          uVar19 = 0;
        } while ((ulong)(long)(int)uVar17 < uVar14);
      }
      else if (uVar14 == 0) goto LAB_0010fc54;
      uVar17 = 0;
      do {
        fxp_free_name(*(fxp_name **)((long)pvVar11 + uVar17 * 8));
        uVar17 = uVar17 + 1;
      } while (uVar14 != uVar17);
LAB_0010fc54:
      safefree(pvVar11);
      return true;
    }
    sVar8 = strlen(fname);
    str_05.len = sVar8;
    str_05.ptr = fname;
    pcVar9 = stripctrl_string_ptrlen(pSVar1,str_05);
    if (pcVar9 == (char *)0x0) {
      return false;
    }
    pcVar10 = fxp_error();
    __format = "%s: unable to open directory: %s\n";
  }
  printf(__format,pcVar9,pcVar10);
LAB_0010f5a8:
  safefree(pcVar9);
  return false;
}

Assistant:

bool sftp_get_file(char *fname, char *outfname, bool recurse, bool restart)
{
    struct fxp_handle *fh;
    struct sftp_packet *pktin;
    struct sftp_request *req;
    struct fxp_xfer *xfer;
    uint64_t offset;
    WFile *file;
    bool toret, shown_err = false;
    struct fxp_attrs attrs;

    /*
     * In recursive mode, see if we're dealing with a directory.
     * (If we're not in recursive mode, we need not even check: the
     * subsequent FXP_OPEN will return a usable error message.)
     */
    if (recurse) {
        bool result;

        req = fxp_stat_send(fname);
        pktin = sftp_wait_for_reply(req);
        result = fxp_stat_recv(pktin, req, &attrs);

        if (result &&
            (attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS) &&
            (attrs.permissions & 0040000)) {

            struct fxp_handle *dirhandle;
            size_t nnames, namesize;
            struct fxp_name **ournames;
            struct fxp_names *names;
            int i;

            /*
             * First, attempt to create the destination directory,
             * unless it already exists.
             */
            if (file_type(outfname) != FILE_TYPE_DIRECTORY &&
                !create_directory(outfname)) {
                with_stripctrl(san, outfname)
                    printf("%s: Cannot create directory\n", san);
                return false;
            }

            /*
             * Now get the list of filenames in the remote
             * directory.
             */
            req = fxp_opendir_send(fname);
            pktin = sftp_wait_for_reply(req);
            dirhandle = fxp_opendir_recv(pktin, req);

            if (!dirhandle) {
                with_stripctrl(san, fname)
                    printf("%s: unable to open directory: %s\n",
                           san, fxp_error());
                return false;
            }
            nnames = namesize = 0;
            ournames = NULL;
            while (1) {
                int i;

                req = fxp_readdir_send(dirhandle);
                pktin = sftp_wait_for_reply(req);
                names = fxp_readdir_recv(pktin, req);

                if (names == NULL) {
                    if (fxp_error_type() == SSH_FX_EOF)
                        break;
                    with_stripctrl(san, fname)
                        printf("%s: reading directory: %s\n",
                               san, fxp_error());

                    req = fxp_close_send(dirhandle);
                    pktin = sftp_wait_for_reply(req);
                    fxp_close_recv(pktin, req);

                    sfree(ournames);
                    return false;
                }
                if (names->nnames == 0) {
                    fxp_free_names(names);
                    break;
                }
                sgrowarrayn(ournames, namesize, nnames, names->nnames);
                for (i = 0; i < names->nnames; i++)
                    if (strcmp(names->names[i].filename, ".") &&
                        strcmp(names->names[i].filename, "..")) {
                        if (!vet_filename(names->names[i].filename)) {
                            with_stripctrl(san, names->names[i].filename)
                                printf("ignoring potentially dangerous server-"
                                       "supplied filename '%s'\n", san);
                        } else {
                            ournames[nnames++] =
                                fxp_dup_name(&names->names[i]);
                        }
                    }
                fxp_free_names(names);
            }
            req = fxp_close_send(dirhandle);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            /*
             * Sort the names into a clear order. This ought to
             * make things more predictable when we're doing a
             * reget of the same directory, just in case two
             * readdirs on the same remote directory return a
             * different order.
             */
            if (nnames > 0)
                qsort(ournames, nnames, sizeof(*ournames), sftp_name_compare);

            /*
             * If we're in restart mode, find the last filename on
             * this list that already exists. We may have to do a
             * reget on _that_ file, but shouldn't have to do
             * anything on the previous files.
             *
             * If none of them exists, of course, we start at 0.
             */
            i = 0;
            if (restart) {
                while (i < nnames) {
                    char *nextoutfname;
                    bool nonexistent;
                    nextoutfname = dir_file_cat(outfname,
                                                ournames[i]->filename);
                    nonexistent = (file_type(nextoutfname) ==
                                   FILE_TYPE_NONEXISTENT);
                    sfree(nextoutfname);
                    if (nonexistent)
                        break;
                    i++;
                }
                if (i > 0)
                    i--;
            }

            /*
             * Now we're ready to recurse. Starting at ournames[i]
             * and continuing on to the end of the list, we
             * construct a new source and target file name, and
             * call sftp_get_file again.
             */
            for (; i < nnames; i++) {
                char *nextfname, *nextoutfname;
                bool retd;

                nextfname = dupcat(fname, "/", ournames[i]->filename);
                nextoutfname = dir_file_cat(outfname, ournames[i]->filename);
                retd = sftp_get_file(
                    nextfname, nextoutfname, recurse, restart);
                restart = false;       /* after first partial file, do full */
                sfree(nextoutfname);
                sfree(nextfname);
                if (!retd) {
                    for (i = 0; i < nnames; i++) {
                        fxp_free_name(ournames[i]);
                    }
                    sfree(ournames);
                    return false;
                }
            }

            /*
             * Done this recursion level. Free everything.
             */
            for (i = 0; i < nnames; i++) {
                fxp_free_name(ournames[i]);
            }
            sfree(ournames);

            return true;
        }
    }

    req = fxp_stat_send(fname);
    pktin = sftp_wait_for_reply(req);
    if (!fxp_stat_recv(pktin, req, &attrs))
        attrs.flags = 0;

    req = fxp_open_send(fname, SSH_FXF_READ, NULL);
    pktin = sftp_wait_for_reply(req);
    fh = fxp_open_recv(pktin, req);

    if (!fh) {
        with_stripctrl(san, fname)
            printf("%s: open for read: %s\n", san, fxp_error());
        return false;
    }

    if (restart) {
        file = open_existing_wfile(outfname, NULL);
    } else {
        file = open_new_file(outfname, GET_PERMISSIONS(attrs, -1));
    }

    if (!file) {
        with_stripctrl(san, outfname)
            printf("local: unable to open %s\n", san);

        req = fxp_close_send(fh);
        pktin = sftp_wait_for_reply(req);
        fxp_close_recv(pktin, req);

        return false;
    }

    if (restart) {
        if (seek_file(file, 0, FROM_END) == -1) {
            close_wfile(file);
            with_stripctrl(san, outfname)
                printf("reget: cannot restart %s - file too large\n", san);
            req = fxp_close_send(fh);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            return false;
        }

        offset = get_file_posn(file);
        printf("reget: restarting at file position %"PRIu64"\n", offset);
    } else {
        offset = 0;
    }

    with_stripctrl(san, fname) {
        with_stripctrl(sano, outfname)
            printf("remote:%s => local:%s\n", san, sano);
    }

    /*
     * FIXME: we can use FXP_FSTAT here to get the file size, and
     * thus put up a progress bar.
     */
    toret = true;
    xfer = xfer_download_init(fh, offset);
    while (!xfer_done(xfer)) {
        void *vbuf;
        int retd, len;
        int wpos, wlen;

        xfer_download_queue(xfer);
        pktin = sftp_recv();
        retd = xfer_download_gotpkt(xfer, pktin);
        if (retd <= 0) {
            if (!shown_err) {
                printf("error while reading: %s\n", fxp_error());
                shown_err = true;
            }
            if (retd == INT_MIN)        /* pktin not even freed */
                sfree(pktin);
            toret = false;
        }

        while (xfer_download_data(xfer, &vbuf, &len)) {
            unsigned char *buf = (unsigned char *)vbuf;

            wpos = 0;
            while (wpos < len) {
                wlen = write_to_file(file, buf + wpos, len - wpos);
                if (wlen <= 0) {
                    printf("error while writing local file\n");
                    toret = false;
                    xfer_set_error(xfer);
                    break;
                }
                wpos += wlen;
            }
            if (wpos < len) {          /* we had an error */
                toret = false;
                xfer_set_error(xfer);
            }

            sfree(vbuf);
        }
    }

    xfer_cleanup(xfer);

    close_wfile(file);

    req = fxp_close_send(fh);
    pktin = sftp_wait_for_reply(req);
    fxp_close_recv(pktin, req);

    return toret;
}